

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Configurations::Configurations
          (Configurations *this,string *configurationFile,bool useDefaultsForRemaining,
          Configurations *base)

{
  Configurations *base_local;
  bool useDefaultsForRemaining_local;
  string *configurationFile_local;
  Configurations *this_local;
  
  el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::
  RegistryWithPred(&this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>);
  (this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0028ffb8;
  std::__cxx11::string::string((string *)&this->m_configurationFile,(string *)configurationFile);
  this->m_isFromFile = false;
  parseFromFile(this,configurationFile,base);
  if (useDefaultsForRemaining) {
    setRemainingToDefault(this);
  }
  return;
}

Assistant:

Configurations::Configurations(const std::string& configurationFile, bool useDefaultsForRemaining,
                               Configurations* base) :
  m_configurationFile(configurationFile),
  m_isFromFile(false) {
  parseFromFile(configurationFile, base);
  if (useDefaultsForRemaining) {
    setRemainingToDefault();
  }
}